

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_t * new_instance(ptls_context_t *ctx,int is_server)

{
  ptls_context_t *__dest;
  long *in_FS_OFFSET;
  ptls_context_t *local_2e0 [87];
  ptls_context_t *local_28;
  ptls_t *tls;
  ptls_context_t *ppStack_18;
  int is_server_local;
  ptls_context_t *ctx_local;
  
  tls._4_4_ = is_server;
  ppStack_18 = ctx;
  if (ctx->get_time == (ptls_get_time_t *)0x0) {
    __assert_fail("ctx->get_time != NULL && \"please set ctx->get_time to `&ptls_get_time`; see #92\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x140e,"ptls_t *new_instance(ptls_context_t *, int)");
  }
  if ((ctx->pre_shared_key).identity.base == (uint8_t *)0x0) {
    if (((((ctx->pre_shared_key).identity.len != 0) ||
         ((ctx->pre_shared_key).secret.base != (uint8_t *)0x0)) ||
        ((ctx->pre_shared_key).secret.len != 0)) ||
       ((ctx->pre_shared_key).hash != (ptls_hash_algorithm_t *)0x0)) {
      __assert_fail("ctx->pre_shared_key.identity.len == 0 && ctx->pre_shared_key.secret.base == NULL && ctx->pre_shared_key.secret.len == 0 && ctx->pre_shared_key.hash == NULL && \"`ptls_context_t::pre_shared_key` in inconsitent state\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x1416,"ptls_t *new_instance(ptls_context_t *, int)");
    }
  }
  else if ((((ctx->pre_shared_key).identity.len == 0) ||
           ((ctx->pre_shared_key).secret.base == (uint8_t *)0x0)) ||
          (((ctx->pre_shared_key).secret.len == 0 ||
           ((ctx->pre_shared_key).hash == (ptls_hash_algorithm_t *)0x0)))) {
    __assert_fail("ctx->pre_shared_key.identity.len != 0 && ctx->pre_shared_key.secret.base != NULL && ctx->pre_shared_key.secret.len != 0 && ctx->pre_shared_key.hash != NULL && \"`ptls_context_t::pre_shared_key` in incosistent state\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x1412,"ptls_t *new_instance(ptls_context_t *, int)");
  }
  local_28 = (ptls_context_t *)malloc(0x2b8);
  if (local_28 == (ptls_context_t *)0x0) {
    ctx_local = (ptls_context_t *)0x0;
  }
  else {
    update_open_count(ppStack_18,1);
    __dest = local_28;
    memset(local_2e0,0,0x2b8);
    local_2e0[0] = ppStack_18;
    memcpy(__dest,local_2e0,0x2b8);
    *(byte *)&local_28[1].max_buffer_size =
         (byte)local_28[1].max_buffer_size & 0xfe | (byte)tls._4_4_ & 1;
    *(byte *)&local_28[1].max_buffer_size =
         (byte)local_28[1].max_buffer_size & 0xfb | ((byte)ppStack_18->field_0xb8 >> 2 & 1) << 2;
    if (*(long *)(*in_FS_OFFSET + -0xd0) == 0) {
      ptls_log_init_conn_state
                ((ptls_log_conn_state_t *)&local_28[1].hkdf_label_prefix__obsolete,
                 ppStack_18->random_bytes);
    }
    else {
      memcpy(&local_28[1].hkdf_label_prefix__obsolete,*(void **)(*in_FS_OFFSET + -0xd0),0x28);
    }
    ctx_local = local_28;
  }
  return (ptls_t *)ctx_local;
}

Assistant:

static ptls_t *new_instance(ptls_context_t *ctx, int is_server)
{
    ptls_t *tls;

    /* check consistency of `ptls_context_t` before instantiating a connection object */
    assert(ctx->get_time != NULL && "please set ctx->get_time to `&ptls_get_time`; see #92");
    if (ctx->pre_shared_key.identity.base != NULL) {
        assert(ctx->pre_shared_key.identity.len != 0 && ctx->pre_shared_key.secret.base != NULL &&
               ctx->pre_shared_key.secret.len != 0 && ctx->pre_shared_key.hash != NULL &&
               "`ptls_context_t::pre_shared_key` in incosistent state");
    } else {
        assert(ctx->pre_shared_key.identity.len == 0 && ctx->pre_shared_key.secret.base == NULL &&
               ctx->pre_shared_key.secret.len == 0 && ctx->pre_shared_key.hash == NULL &&
               "`ptls_context_t::pre_shared_key` in inconsitent state");
    }

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    update_open_count(ctx, 1);
    *tls = (ptls_t){ctx};
    tls->is_server = is_server;
    tls->send_change_cipher_spec = ctx->send_change_cipher_spec;

#if PTLS_HAVE_LOG
    if (ptls_log_conn_state_override != NULL) {
        tls->log_state = *ptls_log_conn_state_override;
    } else {
        ptls_log_init_conn_state(&tls->log_state, ctx->random_bytes);
    }
#endif

    return tls;
}